

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_ToInt32Clamp(JSContext *ctx,int *pres,JSValue val,int min,int max,int min_offset)

{
  int iVar1;
  int iVar2;
  
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)val.u.ptr = *val.u.ptr + 1;
  }
  iVar2 = JS_ToInt32SatFree(ctx,pres,val);
  if (iVar2 == 0) {
    iVar1 = *pres;
    if (iVar1 < min) {
      max = iVar1 + min_offset;
      if (max <= min) {
        max = min;
      }
    }
    else if (iVar1 <= max) {
      return 0;
    }
    *pres = max;
  }
  return iVar2;
}

Assistant:

int JS_ToInt32Clamp(JSContext *ctx, int *pres, JSValueConst val,
                    int min, int max, int min_offset)
{
    int res = JS_ToInt32SatFree(ctx, pres, JS_DupValue(ctx, val));
    if (res == 0) {
        if (*pres < min) {
            *pres += min_offset;
            if (*pres < min)
                *pres = min;
        } else {
            if (*pres > max)
                *pres = max;
        }
    }
    return res;
}